

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffpinit(fitsfile *fptr,int *status)

{
  int iVar1;
  void *pvVar2;
  int *in_RSI;
  int *in_RDI;
  tcolumn *colptr;
  char comm [73];
  double bzero;
  double bscale;
  LONGLONG blank;
  LONGLONG npix;
  LONGLONG naxes [999];
  long gcount;
  long pcount;
  int ntilebins;
  int ii;
  int bytlen;
  int ttype;
  int nspace;
  int extend;
  int naxis;
  int bitpix;
  int simple;
  int tstatus;
  int groups;
  fitsfile *fptr_00;
  int *in_stack_ffffffffffffdfc8;
  char *in_stack_ffffffffffffdfd0;
  int *in_stack_ffffffffffffdfd8;
  char *in_stack_ffffffffffffdfe0;
  fitsfile *in_stack_ffffffffffffdfe8;
  int *in_stack_ffffffffffffdff0;
  int *in_stack_ffffffffffffdff8;
  int in_stack_ffffffffffffe004;
  fitsfile *in_stack_ffffffffffffe008;
  undefined8 local_1fd8;
  undefined8 local_1fd0;
  undefined8 local_1fc8;
  long local_1fc0;
  long local_1fb8 [55];
  LONGLONG *in_stack_ffffffffffffe200;
  int *in_stack_ffffffffffffe208;
  int *in_stack_ffffffffffffe210;
  int *in_stack_ffffffffffffe218;
  int in_stack_ffffffffffffe224;
  fitsfile *in_stack_ffffffffffffe228;
  long *in_stack_ffffffffffffe240;
  long *in_stack_ffffffffffffe248;
  int *in_stack_ffffffffffffe250;
  double *in_stack_ffffffffffffe258;
  double *in_stack_ffffffffffffe260;
  LONGLONG *in_stack_ffffffffffffe268;
  int *in_stack_ffffffffffffe270;
  int *in_stack_ffffffffffffe278;
  fitsfile local_80;
  int local_6c;
  int local_68;
  int local_64;
  undefined4 local_60;
  int local_5c;
  int local_54;
  int local_50;
  int local_48;
  int local_44;
  int *local_40;
  int *local_38;
  int local_2c;
  
  local_60 = 0;
  local_64 = 0;
  if (*in_RSI < 1) {
    local_40 = in_RSI;
    local_38 = in_RDI;
    if (*in_RDI != *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      ffmahd(in_stack_ffffffffffffe008,in_stack_ffffffffffffe004,in_stack_ffffffffffffdff8,
             in_stack_ffffffffffffdff0);
    }
    *(undefined4 *)(*(long *)(local_38 + 2) + 0x58) = 0;
    *(undefined8 *)(*(long *)(local_38 + 2) + 0x70) =
         *(undefined8 *)(*(long *)(local_38 + 2) + 0x30);
    local_44 = 0;
    local_48 = *local_40;
    iVar1 = (int)((ulong)&local_80.Fptr >> 0x20);
    fptr_00 = &local_80;
    ffgphd(in_stack_ffffffffffffe228,in_stack_ffffffffffffe224,in_stack_ffffffffffffe218,
           in_stack_ffffffffffffe210,in_stack_ffffffffffffe208,in_stack_ffffffffffffe200,
           in_stack_ffffffffffffe240,in_stack_ffffffffffffe248,in_stack_ffffffffffffe250,
           in_stack_ffffffffffffe258,in_stack_ffffffffffffe260,in_stack_ffffffffffffe268,
           in_stack_ffffffffffffe270,in_stack_ffffffffffffe278);
    if (*local_40 == 0xe9) {
      *local_40 = local_48;
    }
    else if (0 < *local_40) {
      return *local_40;
    }
    *(long *)(*(long *)(local_38 + 2) + 0x70) =
         *(long *)(*(long *)(local_38 + 2) + 0x80) - (long)((local_5c + 1) * 0x50);
    *(long *)(*(long *)(local_38 + 2) + 0x88) =
         ((*(long *)(*(long *)(local_38 + 2) + 0x80) + -0x50) / 0xb40 + 1) * 0xb40;
    if ((0 < local_54) && (local_1fb8[0] == 0)) {
      local_48 = 0;
      ffmaky(fptr_00,iVar1,(int *)0x166458);
      iVar1 = ffgkyl(in_stack_ffffffffffffdfe8,in_stack_ffffffffffffdfe0,in_stack_ffffffffffffdfd8,
                     in_stack_ffffffffffffdfd0,in_stack_ffffffffffffdfc8);
      if (iVar1 != 0) {
        local_44 = 0;
      }
    }
    if (local_50 == 8) {
      local_60 = 0xb;
      local_64 = 1;
    }
    else if (local_50 == 0x10) {
      local_60 = 0x15;
      local_64 = 2;
    }
    else if (local_50 == 0x20) {
      local_60 = 0x29;
      local_64 = 4;
    }
    else if (local_50 == 0x40) {
      local_60 = 0x51;
      local_64 = 8;
    }
    else if (local_50 == -0x20) {
      local_60 = 0x2a;
      local_64 = 4;
    }
    else if (local_50 == -0x40) {
      local_60 = 0x52;
      local_64 = 8;
    }
    *(int *)(*(long *)(local_38 + 2) + 0x90) = local_54;
    if (local_54 == 0) {
      local_1fc0 = 0;
    }
    else {
      if (local_44 == 0) {
        local_1fc0 = local_1fb8[0];
      }
      else {
        local_1fc0 = 1;
      }
      *(long *)(*(long *)(local_38 + 2) + 0x98) = local_1fb8[0];
      for (local_68 = 1; local_68 < local_54; local_68 = local_68 + 1) {
        local_1fc0 = local_1fc0 * local_1fb8[local_68];
        *(long *)(*(long *)(local_38 + 2) + 0x98 + (long)local_68 * 8) = local_1fb8[local_68];
      }
    }
    *(long *)(*(long *)(*(long *)(local_38 + 2) + 0x68) +
             (long)(*(int *)(*(long *)(local_38 + 2) + 0x54) + 1) * 8) =
         *(long *)(*(long *)(local_38 + 2) + 0x88) +
         ((((long)&(local_80.Fptr)->filehandle + local_1fc0) * (long)local_64 * local_80._0_8_ +
          0xb3f) / 0xb40) * 0xb40;
    *(long *)(*(long *)(local_38 + 2) + 0x3d8) =
         ((long)&(local_80.Fptr)->filehandle + local_1fc0) * (long)local_64 * local_80._0_8_;
    *(undefined8 *)(*(long *)(local_38 + 2) + 0x3e0) = 0;
    *(undefined4 *)(*(long *)(local_38 + 2) + 0x47c) = 0;
    if (local_54 == 0) {
      *(undefined8 *)(*(long *)(local_38 + 2) + 0x3c8) = 0;
      *(undefined4 *)(*(long *)(local_38 + 2) + 0x3b0) = 0;
      if (*(long *)(*(long *)(local_38 + 2) + 0x530) != 0) {
        local_6c = (int)((*(long *)(*(long *)(local_38 + 2) + 0x498) + -1) /
                        *(long *)(*(long *)(local_38 + 2) + 0x440)) + 1;
        for (local_68 = 0; local_68 < local_6c; local_68 = local_68 + 1) {
          if (*(long *)(*(long *)(*(long *)(local_38 + 2) + 0x548) + (long)local_68 * 8) != 0) {
            free(*(void **)(*(long *)(*(long *)(local_38 + 2) + 0x548) + (long)local_68 * 8));
          }
          if (*(long *)(*(long *)(*(long *)(local_38 + 2) + 0x550) + (long)local_68 * 8) != 0) {
            free(*(void **)(*(long *)(*(long *)(local_38 + 2) + 0x550) + (long)local_68 * 8));
          }
        }
        free(*(void **)(*(long *)(local_38 + 2) + 0x558));
        free(*(void **)(*(long *)(local_38 + 2) + 0x540));
        free(*(void **)(*(long *)(local_38 + 2) + 0x538));
        free(*(void **)(*(long *)(local_38 + 2) + 0x550));
        free(*(void **)(*(long *)(local_38 + 2) + 0x548));
        free(*(void **)(*(long *)(local_38 + 2) + 0x530));
        *(undefined8 *)(*(long *)(local_38 + 2) + 0x558) = 0;
        *(undefined8 *)(*(long *)(local_38 + 2) + 0x540) = 0;
        *(undefined8 *)(*(long *)(local_38 + 2) + 0x538) = 0;
        *(undefined8 *)(*(long *)(local_38 + 2) + 0x550) = 0;
        *(undefined8 *)(*(long *)(local_38 + 2) + 0x548) = 0;
        *(undefined8 *)(*(long *)(local_38 + 2) + 0x530) = 0;
      }
      if (*(long *)(*(long *)(local_38 + 2) + 0x3d0) != 0) {
        free(*(void **)(*(long *)(local_38 + 2) + 0x3d0));
      }
      *(undefined8 *)(*(long *)(local_38 + 2) + 0x3d0) = 0;
      *(undefined8 *)(*(long *)(local_38 + 2) + 0x3c0) = 0;
      *(undefined8 *)(*(long *)(local_38 + 2) + 0x3b8) = 0;
    }
    else {
      *(undefined8 *)(*(long *)(local_38 + 2) + 0x3c0) = local_80._0_8_;
      *(undefined8 *)(*(long *)(local_38 + 2) + 0x3b8) = local_80._0_8_;
      *(long *)(*(long *)(local_38 + 2) + 0x3c8) =
           ((long)&(local_80.Fptr)->filehandle + local_1fc0) * (long)local_64;
      *(undefined4 *)(*(long *)(local_38 + 2) + 0x3b0) = 2;
      if (*(long *)(*(long *)(local_38 + 2) + 0x530) != 0) {
        local_6c = (int)((*(long *)(*(long *)(local_38 + 2) + 0x498) + -1) /
                        *(long *)(*(long *)(local_38 + 2) + 0x440)) + 1;
        for (local_68 = 0; local_68 < local_6c; local_68 = local_68 + 1) {
          if (*(long *)(*(long *)(*(long *)(local_38 + 2) + 0x548) + (long)local_68 * 8) != 0) {
            free(*(void **)(*(long *)(*(long *)(local_38 + 2) + 0x548) + (long)local_68 * 8));
          }
          if (*(long *)(*(long *)(*(long *)(local_38 + 2) + 0x550) + (long)local_68 * 8) != 0) {
            free(*(void **)(*(long *)(*(long *)(local_38 + 2) + 0x550) + (long)local_68 * 8));
          }
        }
        free(*(void **)(*(long *)(local_38 + 2) + 0x558));
        free(*(void **)(*(long *)(local_38 + 2) + 0x540));
        free(*(void **)(*(long *)(local_38 + 2) + 0x538));
        free(*(void **)(*(long *)(local_38 + 2) + 0x550));
        free(*(void **)(*(long *)(local_38 + 2) + 0x548));
        free(*(void **)(*(long *)(local_38 + 2) + 0x530));
        *(undefined8 *)(*(long *)(local_38 + 2) + 0x558) = 0;
        *(undefined8 *)(*(long *)(local_38 + 2) + 0x540) = 0;
        *(undefined8 *)(*(long *)(local_38 + 2) + 0x538) = 0;
        *(undefined8 *)(*(long *)(local_38 + 2) + 0x550) = 0;
        *(undefined8 *)(*(long *)(local_38 + 2) + 0x548) = 0;
        *(undefined8 *)(*(long *)(local_38 + 2) + 0x530) = 0;
      }
      if (*(long *)(*(long *)(local_38 + 2) + 0x3d0) != 0) {
        free(*(void **)(*(long *)(local_38 + 2) + 0x3d0));
      }
      pvVar2 = calloc(2,0xa0);
      if (pvVar2 == (void *)0x0) {
        ffpmsg((char *)0x166d2b);
        *(undefined8 *)(*(long *)(local_38 + 2) + 0x3d0) = 0;
        *local_40 = 0x6f;
        return 0x6f;
      }
      *(void **)(*(long *)(local_38 + 2) + 0x3d0) = pvVar2;
      *(undefined8 *)((long)pvVar2 + 0x48) = 0;
      *(undefined4 *)((long)pvVar2 + 0x50) = local_60;
      *(long *)((long)pvVar2 + 0x98) = (long)local_64;
      *(FITSfile **)((long)pvVar2 + 0x58) = local_80.Fptr;
      *(undefined8 *)((long)pvVar2 + 0x60) = 0x3ff0000000000000;
      *(undefined8 *)((long)pvVar2 + 0x68) = 0;
      *(undefined8 *)((long)pvVar2 + 0x70) = local_1fc8;
      *(long *)((long)pvVar2 + 0xe8) = (long)local_80.Fptr * (long)local_64;
      *(undefined4 *)((long)pvVar2 + 0xf0) = local_60;
      *(long *)((long)pvVar2 + 0x138) = (long)local_64;
      *(long *)((long)pvVar2 + 0xf8) = local_1fc0;
      *(undefined8 *)((long)pvVar2 + 0x100) = local_1fd0;
      *(undefined8 *)((long)pvVar2 + 0x108) = local_1fd8;
      *(undefined8 *)((long)pvVar2 + 0x110) = local_1fc8;
    }
    *(undefined8 *)(*(long *)(local_38 + 2) + 0x80) =
         *(undefined8 *)
          (*(long *)(*(long *)(local_38 + 2) + 0x68) +
          (long)*(int *)(*(long *)(local_38 + 2) + 0x54) * 8);
    local_2c = *local_40;
  }
  else {
    local_2c = *in_RSI;
  }
  return local_2c;
}

Assistant:

int ffpinit(fitsfile *fptr,      /* I - FITS file pointer */
           int *status)          /* IO - error status     */
/*
  initialize the parameters defining the structure of the primary array
  or an Image extension 
*/
{
    int groups, tstatus, simple, bitpix, naxis, extend, nspace;
    int ttype = 0, bytlen = 0, ii, ntilebins;
    long  pcount, gcount;
    LONGLONG naxes[999], npix, blank;
    double bscale, bzero;
    char comm[FLEN_COMMENT];
    tcolumn *colptr;

    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    (fptr->Fptr)->hdutype = IMAGE_HDU; /* primary array or IMAGE extension  */
    (fptr->Fptr)->headend = (fptr->Fptr)->logfilesize;  /* set max size */

    groups = 0;
    tstatus = *status;

    /* get all the descriptive info about this HDU */
    ffgphd(fptr, 999, &simple, &bitpix, &naxis, naxes, &pcount, &gcount, 
           &extend, &bscale, &bzero, &blank, &nspace, status);

    if (*status == NOT_IMAGE)
        *status = tstatus;    /* ignore 'unknown extension type' error */
    else if (*status > 0)
        return(*status);

    /*
       the logical end of the header is 80 bytes before the current position, 
       minus any trailing blank keywords just before the END keyword.
    */
    (fptr->Fptr)->headend = (fptr->Fptr)->nextkey - (80 * (nspace + 1));

    /* the data unit begins at the beginning of the next logical block */
    (fptr->Fptr)->datastart = (((fptr->Fptr)->nextkey - 80) / 2880 + 1)
                              * 2880;

    if (naxis > 0 && naxes[0] == 0)  /* test for 'random groups' */
    {
        tstatus = 0;
        ffmaky(fptr, 2, status);         /* reset to beginning of header */

        if (ffgkyl(fptr, "GROUPS", &groups, comm, &tstatus))
            groups = 0;          /* GROUPS keyword not found */
    }

    if (bitpix == BYTE_IMG)   /* test  bitpix and set the datatype code */
    {
        ttype=TBYTE;
        bytlen=1;
    }
    else if (bitpix == SHORT_IMG)
    {
        ttype=TSHORT;
        bytlen=2;
    }
    else if (bitpix == LONG_IMG)
    {
        ttype=TLONG;
        bytlen=4;
    }
    else if (bitpix == LONGLONG_IMG)
    {
        ttype=TLONGLONG;
        bytlen=8;
    }
    else if (bitpix == FLOAT_IMG)
    {
        ttype=TFLOAT;
        bytlen=4;
    }
    else if (bitpix == DOUBLE_IMG)
    {
        ttype=TDOUBLE;
        bytlen=8;
    }
        
    /*   calculate the size of the primary array  */
    (fptr->Fptr)->imgdim = naxis;
    if (naxis == 0)
    {
        npix = 0;
    }
    else
    {
        if (groups)
        {
            npix = 1;  /* NAXIS1 = 0 is a special flag for 'random groups' */
        }
        else
        {
            npix = naxes[0];
        }

        (fptr->Fptr)->imgnaxis[0] = naxes[0];
        for (ii=1; ii < naxis; ii++)
        {
            npix = npix*naxes[ii];   /* calc number of pixels in the array */
            (fptr->Fptr)->imgnaxis[ii] = naxes[ii];
        }
    }

    /*
       now we know everything about the array; just fill in the parameters:
       the next HDU begins in the next logical block after the data
    */

    (fptr->Fptr)->headstart[ (fptr->Fptr)->curhdu + 1] =
         (fptr->Fptr)->datastart + 
         ( ((LONGLONG) pcount + npix) * bytlen * gcount + 2879) / 2880 * 2880;

    /*
      initialize the fictitious heap starting address (immediately following
      the array data) and a zero length heap.  This is used to find the
      end of the data when checking the fill values in the last block. 
    */
    (fptr->Fptr)->heapstart = (npix + pcount) * bytlen * gcount;
    (fptr->Fptr)->heapsize = 0;

    (fptr->Fptr)->compressimg = 0;  /* this is not a compressed image */

    if (naxis == 0)
    {
        (fptr->Fptr)->rowlength = 0;    /* rows have zero length */
        (fptr->Fptr)->tfield = 0;       /* table has no fields   */

        /* free the tile-compressed image cache, if it exists */
        if ((fptr->Fptr)->tilerow) {
           ntilebins = 
	    (((fptr->Fptr)->znaxis[0] - 1) / ((fptr->Fptr)->tilesize[0])) + 1;

           for (ii = 0; ii < ntilebins; ii++) {
             if ((fptr->Fptr)->tiledata[ii]) {
	       free((fptr->Fptr)->tiledata[ii]);
             }

             if ((fptr->Fptr)->tilenullarray[ii]) {
	       free((fptr->Fptr)->tilenullarray[ii]);
             }
            }
	    
	    free((fptr->Fptr)->tileanynull);
	    free((fptr->Fptr)->tiletype);	   
	    free((fptr->Fptr)->tiledatasize);
	    free((fptr->Fptr)->tilenullarray);
	    free((fptr->Fptr)->tiledata);
	    free((fptr->Fptr)->tilerow);

	    (fptr->Fptr)->tileanynull = 0;
	    (fptr->Fptr)->tiletype = 0;	   
	    (fptr->Fptr)->tiledatasize = 0;
	    (fptr->Fptr)->tilenullarray = 0;
	    (fptr->Fptr)->tiledata = 0;
	    (fptr->Fptr)->tilerow = 0;
        }

        if ((fptr->Fptr)->tableptr)
           free((fptr->Fptr)->tableptr); /* free memory for the old CHDU */

        (fptr->Fptr)->tableptr = 0;     /* set a null table structure pointer */
        (fptr->Fptr)->numrows = 0;
        (fptr->Fptr)->origrows = 0;
    }
    else
    {
      /*
        The primary array is actually interpreted as a binary table.  There
        are two columns: the first column contains the group parameters if any.
        The second column contains the primary array of data as a single vector
        column element. In the case of 'random grouped' format, each group
        is stored in a separate row of the table.
      */
        /* the number of rows is equal to the number of groups */
        (fptr->Fptr)->numrows = gcount;
        (fptr->Fptr)->origrows = gcount;

        (fptr->Fptr)->rowlength = (npix + pcount) * bytlen; /* total size */
        (fptr->Fptr)->tfield = 2;  /* 2 fields: group params and the image */

        /* free the tile-compressed image cache, if it exists */
        if ((fptr->Fptr)->tilerow) {

           ntilebins = 
	    (((fptr->Fptr)->znaxis[0] - 1) / ((fptr->Fptr)->tilesize[0])) + 1;

           for (ii = 0; ii < ntilebins; ii++) {
             if ((fptr->Fptr)->tiledata[ii]) {
	       free((fptr->Fptr)->tiledata[ii]);
             }

             if ((fptr->Fptr)->tilenullarray[ii]) {
	       free((fptr->Fptr)->tilenullarray[ii]);
             }
            }
	    
	    free((fptr->Fptr)->tileanynull);
	    free((fptr->Fptr)->tiletype);	   
	    free((fptr->Fptr)->tiledatasize);
	    free((fptr->Fptr)->tilenullarray);
	    free((fptr->Fptr)->tiledata);
	    free((fptr->Fptr)->tilerow);

	    (fptr->Fptr)->tileanynull = 0;
	    (fptr->Fptr)->tiletype = 0;	   
	    (fptr->Fptr)->tiledatasize = 0;
	    (fptr->Fptr)->tilenullarray = 0;
	    (fptr->Fptr)->tiledata = 0;
	    (fptr->Fptr)->tilerow = 0;
        }

        if ((fptr->Fptr)->tableptr)
           free((fptr->Fptr)->tableptr); /* free memory for the old CHDU */

        colptr = (tcolumn *) calloc(2, sizeof(tcolumn) ) ;

        if (!colptr)
        {
          ffpmsg
          ("malloc failed to get memory for FITS array descriptors (ffpinit)");
          (fptr->Fptr)->tableptr = 0;  /* set a null table structure pointer */
          return(*status = ARRAY_TOO_BIG);
        }

        /* copy the table structure address to the fitsfile structure */
        (fptr->Fptr)->tableptr = colptr; 

        /* the first column represents the group parameters, if any */
        colptr->tbcol = 0;
        colptr->tdatatype = ttype;
        colptr->twidth = bytlen;
        colptr->trepeat = (LONGLONG) pcount;
        colptr->tscale = 1.;
        colptr->tzero = 0.;
        colptr->tnull = blank;

        colptr++;  /* increment pointer to the second column */

        /* the second column represents the image array */
        colptr->tbcol = pcount * bytlen; /* col starts after the group parms */
        colptr->tdatatype = ttype; 
        colptr->twidth = bytlen;
        colptr->trepeat = npix;
        colptr->tscale = bscale;
        colptr->tzero = bzero;
        colptr->tnull = blank;
    }

    /* reset next keyword pointer to the start of the header */
    (fptr->Fptr)->nextkey = (fptr->Fptr)->headstart[ (fptr->Fptr)->curhdu ];

    return(*status);
}